

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeTracer.cpp
# Opt level: O1

void __thiscall
OctreeTracer::CmdBeamRenderPass
          (OctreeTracer *this,shared_ptr<myvk::CommandBuffer> *command_buffer,uint32_t current_frame
          )

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pFVar3;
  CommandBuffer *pCVar4;
  element_type *peVar5;
  pointer psVar6;
  long lVar7;
  float fVar8;
  initializer_list<VkClearValue> __l;
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l_00;
  initializer_list<VkRect2D> __l_01;
  initializer_list<VkViewport> __l_02;
  float origin_size;
  undefined8 uStack_c0;
  vector<VkClearValue,_std::allocator<VkClearValue>_> local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  VkClearValue local_78;
  pointer local_68;
  Ptr<PipelineBase> local_58;
  int local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (this->m_beam_enable == true) {
    pFVar3 = (this->m_frame_resources).
             super__Vector_base<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar4 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_78.depthStencil.depth = 0.0;
    local_78.depthStencil.stencil = 0;
    local_78._8_8_ = 0x3f80000000000000;
    __l._M_len = 1;
    __l._M_array = &local_78;
    std::vector<VkClearValue,_std::allocator<VkClearValue>_>::vector
              (&local_b8,__l,(allocator_type *)&local_98);
    myvk::CommandBuffer::CmdBeginRenderPass
              (pCVar4,&this->m_beam_render_pass,&pFVar3[current_frame].m_beam_framebuffer,&local_b8,
               VK_SUBPASS_CONTENTS_INLINE);
    if (local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pCVar4 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(this->m_beam_graphics_pipeline).
                  super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(this->m_beam_graphics_pipeline).
                  super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    if (local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
                super__Vector_impl_data._M_finish + 8) =
             *(_Atomic_word *)
              ((long)local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
                super__Vector_impl_data._M_finish + 8) =
             *(_Atomic_word *)
              ((long)local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 8) + 1;
      }
    }
    myvk::CommandBuffer::CmdBindPipeline(pCVar4,(Ptr<PipelineBase> *)&local_b8);
    if (local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 &(local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
                   super__Vector_impl_data._M_finish)->depthStencil);
    }
    pCVar4 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar5 = (this->m_octree_ptr).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(peVar5->m_descriptor_set).
                  super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(peVar5->m_descriptor_set).
                  super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    if (local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
                super__Vector_impl_data._M_finish + 8) =
             *(_Atomic_word *)
              ((long)local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
                super__Vector_impl_data._M_finish + 8) =
             *(_Atomic_word *)
              ((long)local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 8) + 1;
      }
    }
    psVar6 = (((this->m_camera_ptr).super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_descriptor_sets).
             super__Vector_base<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         *(pointer *)
          &psVar6[current_frame].super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>
    ;
    local_a0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)(psVar6 + current_frame) + 8);
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_a0->_M_use_count = local_a0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_a0->_M_use_count = local_a0->_M_use_count + 1;
      }
    }
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&local_b8;
    std::
    vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
    ::vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
              *)&local_78,__l_00,(allocator_type *)((long)&uStack_c0 + 7));
    local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &((this->m_beam_graphics_pipeline).
           super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_PipelineBase;
    local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->m_beam_graphics_pipeline).
         super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    myvk::CommandBuffer::CmdBindDescriptorSets
              (pCVar4,(vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
                       *)&local_78,&local_58,&local_98);
    if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
    ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
               *)&local_78);
    lVar7 = 0x20;
    do {
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_c0 + lVar7) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_c0 + lVar7));
      }
      lVar7 = lVar7 + -0x10;
    } while (lVar7 != 0);
    uVar1 = this->m_width;
    uVar2 = this->m_height;
    local_48 = (uVar1 + 7 >> 3) + 1;
    iStack_44 = (uVar2 + 7 >> 3) + 1;
    uStack_40 = 1;
    uStack_3c = 1;
    pCVar4 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_78.depthStencil.depth = 0.0;
    local_78.depthStencil.stencil = 0;
    local_78._12_4_ = iStack_44;
    local_78._8_4_ = local_48;
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_78;
    std::vector<VkRect2D,_std::allocator<VkRect2D>_>::vector
              ((vector<VkRect2D,_std::allocator<VkRect2D>_> *)&local_b8,__l_01,
               (allocator_type *)&local_98);
    myvk::CommandBuffer::CmdSetScissor
              (pCVar4,(vector<VkRect2D,_std::allocator<VkRect2D>_> *)&local_b8);
    if (local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_78._8_8_ = CONCAT44((float)iStack_44,(float)local_48);
    pCVar4 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_78.depthStencil.depth = 0.0;
    local_78.depthStencil.stencil = 0;
    local_68 = (pointer)0x0;
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)&local_78;
    std::vector<VkViewport,_std::allocator<VkViewport>_>::vector
              ((vector<VkViewport,_std::allocator<VkViewport>_> *)&local_b8,__l_02,
               (allocator_type *)&local_98);
    myvk::CommandBuffer::CmdSetViewport
              (pCVar4,(vector<VkViewport,_std::allocator<VkViewport>_> *)&local_b8);
    if (local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)&this->m_width;
    local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_b8.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_4_,8);
    myvk::CommandBuffer::CmdPushConstants
              ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr,&this->m_beam_pipeline_layout,0x10,0,0xc,&local_b8);
    fVar8 = exp2f(1.0 - (float)((this->m_octree_ptr).
                                super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                               m_level);
    local_78.depthStencil.depth = fVar8;
    myvk::CommandBuffer::CmdPushConstants
              ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr,&this->m_beam_pipeline_layout,0x10,0xc,4,&local_78);
    myvk::CommandBuffer::CmdDraw
              ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr,3,1,0,0);
    myvk::CommandBuffer::CmdEndRenderPass
              ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr);
  }
  return;
}

Assistant:

void OctreeTracer::CmdBeamRenderPass(const std::shared_ptr<myvk::CommandBuffer> &command_buffer,
                                     uint32_t current_frame) const {
	if (!m_beam_enable)
		return;
	const auto &cur = m_frame_resources[current_frame];
	command_buffer->CmdBeginRenderPass(m_beam_render_pass, cur.m_beam_framebuffer, {{{0.0f, 0.0f, 0.0f, 1.0f}}});
	command_buffer->CmdBindPipeline(m_beam_graphics_pipeline);
	command_buffer->CmdBindDescriptorSets(
	    {m_octree_ptr->GetDescriptorSet(), m_camera_ptr->GetFrameDescriptorSet(current_frame)},
	    m_beam_graphics_pipeline);

	uint32_t beam_width = get_beam_size(m_width), beam_height = get_beam_size(m_height);
	VkRect2D scissor = {};
	scissor.extent = {beam_width, beam_height};
	command_buffer->CmdSetScissor({scissor});
	VkViewport viewport = {};
	viewport.width = beam_width;
	viewport.height = beam_height;
	command_buffer->CmdSetViewport({viewport});

	uint32_t uint_push_constants[] = {m_width, m_height, kBeamSize};
	command_buffer->CmdPushConstants(m_beam_pipeline_layout, VK_SHADER_STAGE_FRAGMENT_BIT, 0,
	                                 sizeof(uint_push_constants), uint_push_constants);
	float origin_size = exp2f(1.0f - m_octree_ptr->GetLevel());
	command_buffer->CmdPushConstants(m_beam_pipeline_layout, VK_SHADER_STAGE_FRAGMENT_BIT, sizeof(uint_push_constants),
	                                 sizeof(float), &origin_size);
	command_buffer->CmdDraw(3, 1, 0, 0);
	command_buffer->CmdEndRenderPass();
}